

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void pagerUnlockAndRollback(Pager *pPager)

{
  u8 uVar1;
  
  uVar1 = pPager->eState;
  if (uVar1 != '\0') {
    if (uVar1 == '\x01') {
      if (pPager->exclusiveMode == '\0') {
        pager_end_transaction(pPager,0,0);
      }
    }
    else if (uVar1 != '\x06') {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      sqlite3PagerRollback(pPager);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
    }
  }
  pager_unlock(pPager);
  return;
}

Assistant:

static void pagerUnlockAndRollback(Pager *pPager){
  if( pPager->eState!=PAGER_ERROR && pPager->eState!=PAGER_OPEN ){
    assert( assert_pager_state(pPager) );
    if( pPager->eState>=PAGER_WRITER_LOCKED ){
      sqlite3BeginBenignMalloc();
      sqlite3PagerRollback(pPager);
      sqlite3EndBenignMalloc();
    }else if( !pPager->exclusiveMode ){
      assert( pPager->eState==PAGER_READER );
      pager_end_transaction(pPager, 0, 0);
    }
  }
  pager_unlock(pPager);
}